

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O3

void DictionaryStats::OutputStats(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  DictionaryType *pDVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  DictionaryStats *pDVar7;
  DictionaryType *type;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  double dVar31;
  undefined1 auVar29 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  double dStack_70;
  undefined1 local_58 [16];
  double local_40;
  double local_38;
  undefined1 auVar30 [16];
  
  if (dictionaryTypes != (DictionaryType *)0x0) {
    CCLock::Enter(&dictionaryTypesCriticalSection.super_CCLock);
    pDVar3 = dictionaryTypes;
    Output::Print(L"PROFILE DICTIONARY\n");
    Output::Print(L"%8s  %13s  %13s  %13s  %13s  %13s  %13s  %13s  %14s  %14s  %13s  %13s  %13s    %s\n"
                  ,L"Metric",L"StartSize",L"EndSize",L"Resizes",L"Items",L"MaxDepth",L"EmptyBuckets"
                  ,L"Lookups",L"Collisions",L"AvgLookupDepth",L"AvgCollDepth",L"MaxLookupDepth",
                  L"Instances",L"Type");
    for (; pDVar3 != (DictionaryType *)0x0; pDVar3 = pDVar3->pNext) {
      pDVar7 = pDVar3->instances;
      if (pDVar7 == (DictionaryStats *)0x0) {
        dVar8 = 0.0;
        dVar9 = 0.0;
        dVar12 = 0.0;
        dVar13 = 0.0;
        dVar17 = 0.0;
        dVar14 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = local_58._8_8_;
        local_58 = auVar34 << 0x40;
        uVar27 = 0;
        auVar34 = ZEXT816(0);
        dStack_70 = 0.0;
      }
      else {
        auVar30 = ZEXT816(0);
        local_38 = 0.0;
        local_40 = 0.0;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_58._8_8_;
        local_58 = auVar10 << 0x40;
        auVar10 = (undefined1  [16])0x0;
        auVar34 = ZEXT816(0);
        auVar21 = ZEXT816(0);
        dVar8 = 0.0;
        dVar9 = 0.0;
        dVar12 = 0.0;
        dVar13 = 0.0;
        dVar14 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar17 = 0.0;
        dVar22 = 0.0;
        do {
          auVar36 = ZEXT816(0);
          auVar1._0_4_ = pDVar7->itemCount;
          auVar1._4_4_ = pDVar7->maxDepth;
          auVar1._8_4_ = pDVar7->lookupCount;
          auVar1._12_4_ = pDVar7->collisionCount;
          auVar28._4_4_ = 0;
          auVar28._0_4_ = auVar1._8_4_;
          auVar28._8_4_ = auVar1._12_4_;
          auVar28._12_4_ = 0;
          auVar37._8_8_ = 0x4330000000000000;
          auVar37._0_8_ = 0x4330000000000000;
          dVar26 = SUB168(auVar28 | auVar37,0) - 4503599627370496.0;
          dVar31 = SUB168(auVar28 | auVar37,8) - 4503599627370496.0;
          auVar19 = auVar21;
          if (pDVar7->lookupCount != 0) {
            auVar36._0_8_ = (double)pDVar7->lookupDepthTotal / dVar26;
            auVar36._8_8_ = 0;
            auVar19._0_8_ = (double)local_58._0_8_ + auVar36._0_8_;
            auVar19._8_8_ = 0;
            local_58._0_8_ = auVar19._0_8_;
            if (local_40 < auVar36._0_8_) {
              local_40 = auVar36._0_8_;
            }
          }
          auVar2._0_4_ = pDVar7->initialSize;
          auVar2._4_4_ = pDVar7->finalSize;
          auVar2._8_4_ = pDVar7->countOfEmptyBuckets;
          auVar2._12_4_ = pDVar7->countOfResize;
          auVar37 = pmovzxdq(auVar36,auVar2);
          auVar4._8_8_ = 0x4330000000000000;
          auVar4._0_8_ = 0x4330000000000000;
          dVar35 = SUB168(auVar37 | auVar4,0) - 4503599627370496.0;
          dVar38 = SUB168(auVar37 | auVar4,8) - 4503599627370496.0;
          auVar37 = pmovzxdq(auVar19,auVar1);
          auVar5._8_8_ = 0x4330000000000000;
          auVar5._0_8_ = 0x4330000000000000;
          dVar18 = SUB168(auVar37 | auVar5,0) - 4503599627370496.0;
          auVar20._8_8_ = SUB168(auVar37 | auVar5,8) - 4503599627370496.0;
          auVar24._4_4_ = 0;
          auVar24._0_4_ = auVar2._8_4_;
          auVar24._8_4_ = auVar2._12_4_;
          auVar24._12_4_ = 0;
          auVar6._8_8_ = 0x4330000000000000;
          auVar6._0_8_ = 0x4330000000000000;
          dVar23 = SUB168(auVar24 | auVar6,0) - 4503599627370496.0;
          dVar25 = SUB168(auVar24 | auVar6,8) - 4503599627370496.0;
          auVar11._8_8_ = dVar18;
          auVar11._0_8_ = dVar25;
          auVar20._0_8_ = dVar31;
          if ((auVar1._12_4_ != 0) &&
             (dVar32 = (double)pDVar7->lookupDepthTotal / dVar31, local_38 < dVar32)) {
            local_38 = dVar32;
          }
          auVar29._8_8_ = dVar38;
          auVar29._0_8_ = dVar35;
          dVar16 = dVar16 + dVar31;
          dVar17 = dVar17 + auVar20._8_8_;
          auVar33._8_8_ = dVar26;
          auVar33._0_8_ = dVar23;
          dVar14 = dVar14 + dVar23;
          dVar15 = dVar15 + dVar26;
          dVar12 = dVar12 + dVar25;
          dVar13 = dVar13 + dVar18;
          dVar8 = dVar8 + dVar35;
          dVar9 = dVar9 + dVar38;
          auVar21 = maxpd(auVar20,auVar21);
          dStack_70 = auVar21._8_8_;
          auVar34 = maxpd(auVar33,auVar34);
          auVar10 = maxpd(auVar11,auVar10);
          auVar30 = maxpd(auVar29,auVar30);
          uVar27 = auVar30._0_8_;
          dVar26 = (double)pDVar7->maxLookupDepth;
          if ((double)pDVar7->maxLookupDepth <= dVar22) {
            dVar26 = dVar22;
          }
          pDVar7 = pDVar7->pNext;
          dVar22 = dVar26;
        } while (pDVar7 != (DictionaryStats *)0x0);
      }
      if ((double)DAT_015ada8c <= dStack_70) {
        dVar22 = (double)pDVar3->instancesCount;
        Output::Print(L"%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n"
                      ,dVar8 / dVar22,dVar9 / dVar22,dVar12 / dVar22,dVar13 / dVar22,dVar17 / dVar22
                      ,dVar14 / dVar22,dVar15 / dVar22,dVar16 / dVar22,L"AVG:",
                      (ulong)(uint)pDVar3->instancesCount,pDVar3->name);
        Output::Print(L"%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n\n"
                      ,uVar27,L"MAX:",(ulong)(uint)pDVar3->instancesCount,pDVar3->name);
        local_58 = auVar34;
      }
    }
    Output::Print(
                 L"====================================================================================\n"
                 );
    ClearStats();
    CCLock::Leave(&dictionaryTypesCriticalSection.super_CCLock);
    return;
  }
  return;
}

Assistant:

void DictionaryStats::OutputStats()
{
    if (!dictionaryTypes)
        return;

    DictionaryStats::dictionaryTypesCriticalSection.Enter();
    DictionaryType* current = dictionaryTypes;
    Output::Print(_u("PROFILE DICTIONARY\n"));
    Output::Print(_u("%8s  %13s  %13s  %13s  %13s  %13s  %13s  %13s  %14s  %14s  %13s  %13s  %13s    %s\n"), _u("Metric"),_u("StartSize"), _u("EndSize"), _u("Resizes"), _u("Items"), _u("MaxDepth"), _u("EmptyBuckets"), _u("Lookups"), _u("Collisions"), _u("AvgLookupDepth"), _u("AvgCollDepth"), _u("MaxLookupDepth"), _u("Instances"), _u("Type"));
    while(current)
    {
        DictionaryType *type = current;

        DictionaryStats *instance = type->instances;
        double size = 0, max_size = 0;
        double endSize = 0, max_endSize = 0;
        double resizes = 0, max_resizes = 0;
        double items = 0, max_items = 0;
        double depth = 0, max_depth = 0;
        double empty = 0, max_empty = 0;
        double lookups = 0, max_lookups = 0;
        double collisions = 0, max_collisions = 0;
        double avglookupdepth = 0, max_avglookupdepth = 0;
        double avgcollisiondepth = 0, max_avgcollisiondepth = 0;
        double maxlookupdepth = 0, max_maxlookupdepth = 0;

        bool dumpInstances = false;
        //if(strstr(type->name, "SimpleDictionaryPropertyDescriptor") != nullptr)
        //{
        //    dumpInstances = true;
        //}
        while(instance)
        {
            ComputeStats(instance->initialSize, size, max_size);
            ComputeStats(instance->finalSize, endSize, max_endSize);
            ComputeStats(instance->countOfResize, resizes, max_resizes);
            ComputeStats(instance->itemCount, items, max_items);
            ComputeStats(instance->maxDepth, depth, max_depth);
            ComputeStats(instance->countOfEmptyBuckets, empty, max_empty);
            ComputeStats(instance->lookupCount, lookups, max_lookups);
            ComputeStats(instance->collisionCount, collisions, max_collisions);
            if (instance->lookupCount > 0)
            {
                ComputeStats((double)instance->lookupDepthTotal / (double)instance->lookupCount, avglookupdepth, max_avglookupdepth);
            }
            if (instance->collisionCount > 0)
            {
                ComputeStats((double)instance->lookupDepthTotal / (double)instance->collisionCount, avgcollisiondepth, max_avgcollisiondepth);
            }
            ComputeStats(instance->maxLookupDepth, maxlookupdepth, max_maxlookupdepth);

            if(dumpInstances)
            {
                double avgld = 0.0;
                double avgcd = 0.0;
                if (instance->lookupCount > 0)
                {
                    avgld = (double)instance->lookupDepthTotal / (double)instance->lookupCount;
                    avgcd = (double)instance->lookupDepthTotal / (double)instance->collisionCount;
                }
                Output::Print(_u("%8s  %13d  %13d  %13d  %13d  %13d  %13d  %13d  %14d  %14.2f  %13.2f  %13d \n"),
                    _u("INS:"),
                    instance->initialSize, instance->finalSize, instance->countOfResize,
                    instance->itemCount, instance->maxDepth, instance->countOfEmptyBuckets,
                    instance->lookupCount, instance->collisionCount, avgld, avgcd,
                    instance->maxLookupDepth);
            }
            instance = instance->pNext;
        }

        if (max_depth >= Js::Configuration::Global.flags.ProfileDictionary)
        {
            Output::Print(_u("%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n"), _u("AVG:"),
                size/type->instancesCount, endSize/type->instancesCount, resizes/type->instancesCount, items/type->instancesCount,
                depth/type->instancesCount, empty/type->instancesCount, lookups/type->instancesCount, collisions/type->instancesCount,
                avglookupdepth/type->instancesCount, avgcollisiondepth/type->instancesCount, maxlookupdepth/type->instancesCount, type->instancesCount, type->name);
            Output::Print(_u("%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n\n"), _u("MAX:"),
                max_size, max_endSize, max_resizes, max_items, max_depth, max_empty, max_lookups, max_collisions, max_avglookupdepth,
                max_avgcollisiondepth, max_maxlookupdepth, type->instancesCount, type->name);

        }
        current = current->pNext;
    }
    Output::Print(_u("====================================================================================\n"));
    ClearStats();
    DictionaryStats::dictionaryTypesCriticalSection.Leave();
}